

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding.cpp
# Opt level: O0

int __thiscall ncnn::Padding::load_param(Padding *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  long in_RDI;
  float fVar2;
  
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)(in_RDI + 0xb8) = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,0);
  *(int *)(in_RDI + 0xbc) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,0);
  *(int *)(in_RDI + 0xc0) = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,0);
  *(int *)(in_RDI + 0xc4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,4,0);
  *(int *)(in_RDI + 200) = iVar1;
  fVar2 = ParamDict::get(in_RSI,5,0.0);
  *(float *)(in_RDI + 0xcc) = fVar2;
  iVar1 = ParamDict::get(in_RSI,6,0);
  *(int *)(in_RDI + 0xd0) = iVar1;
  if ((((*(int *)(in_RDI + 0xb8) == -0xe9) && (*(int *)(in_RDI + 0xbc) == -0xe9)) &&
      (*(int *)(in_RDI + 0xc0) == -0xe9)) && (*(int *)(in_RDI + 0xc4) == -0xe9)) {
    *(undefined1 *)(in_RDI + 8) = 0;
  }
  return 0;
}

Assistant:

int Padding::load_param(const ParamDict& pd)
{
    top = pd.get(0, 0);
    bottom = pd.get(1, 0);
    left = pd.get(2, 0);
    right = pd.get(3, 0);
    type = pd.get(4, 0);
    value = pd.get(5, 0.f);
    per_channel_pad_data_size = pd.get(6, 0);

    if (top == -233 && bottom == -233 && left == -233 && right == -233)
    {
        one_blob_only = false;
    }

    return 0;
}